

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O2

void __thiscall
embree::FastAllocator::AllStatistics::AllStatistics(AllStatistics *this,FastAllocator *alloc)

{
  this->bytesUsed = (alloc->bytesUsed).super___atomic_base<unsigned_long>._M_i;
  this->bytesFree = (alloc->bytesFree).super___atomic_base<unsigned_long>._M_i;
  this->bytesWasted = (alloc->bytesWasted).super___atomic_base<unsigned_long>._M_i;
  Statistics::Statistics(&this->stat_all,alloc,ANY_TYPE,false);
  Statistics::Statistics(&this->stat_malloc,alloc,ALIGNED_MALLOC,false);
  Statistics::Statistics(&this->stat_4K,alloc,EMBREE_OS_MALLOC,false);
  Statistics::Statistics(&this->stat_2M,alloc,EMBREE_OS_MALLOC,true);
  Statistics::Statistics(&this->stat_shared,alloc,SHARED,false);
  return;
}

Assistant:

AllStatistics (FastAllocator* alloc)

      : bytesUsed(alloc->bytesUsed),
        bytesFree(alloc->bytesFree),
        bytesWasted(alloc->bytesWasted),
        stat_all(alloc,ANY_TYPE),
        stat_malloc(alloc,ALIGNED_MALLOC),
        stat_4K(alloc,EMBREE_OS_MALLOC,false),
        stat_2M(alloc,EMBREE_OS_MALLOC,true),
        stat_shared(alloc,SHARED) {}